

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O0

Expected<renderdesc::Command::Index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
renderdesc::Loader::getTextureIndex
          (Expected<renderdesc::Command::Index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this,string *s)

{
  bool bVar1;
  undefined8 uVar2;
  size_type __n;
  reference value;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98 [3];
  string local_80;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  string *s_local;
  Loader *this_local;
  
  it._M_current = s;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&(this->names_).texture);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&(this->names_).texture);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_30,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_38,it._M_current);
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&(this->names_).texture);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_40);
  if (bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_80,"Unknown texture %s",uVar2);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_60,&local_80);
    Expected<renderdesc::Command::Index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_60);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    local_98[0]._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&(this->names_).texture);
    __n = __gnu_cxx::operator-(&local_28,local_98);
    value = std::vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>::
            operator[](&(this->indexes_).texture,__n);
    Expected<renderdesc::Command::Index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<Command::Index, std::string> getTextureIndex(const std::string &s) {
		const auto it = std::find(names_.texture.begin(), names_.texture.end(), s);
		if (it == names_.texture.end())
			return Unexpected(format("Unknown texture %s", s.c_str()));

		return indexes_.texture[it - names_.texture.begin()];
	}